

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FixedBlockMemoryAllocator.cpp
# Opt level: O0

void * __thiscall Diligent::FixedBlockMemoryAllocator::MemoryPage::Allocate(MemoryPage *this)

{
  Char *pCVar1;
  undefined8 *ptr;
  void *pvVar2;
  uint uVar3;
  char (*in_RCX) [29];
  undefined1 local_a0 [8];
  string msg_2;
  void *res;
  void **ppNextBlock;
  void *pUninitializedBlock;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  MemoryPage *this_local;
  
  msg.field_2._8_8_ = this;
  if (this->m_pOwnerAllocator == (FixedBlockMemoryAllocator *)0x0) {
    FormatString<char[26],char[29]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pOwnerAllocator != nullptr",in_RCX);
    pCVar1 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar1,"Allocate",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
               ,0x67);
    std::__cxx11::string::~string((string *)local_38);
  }
  if (this->m_NumFreeBlocks == 0) {
    if (this->m_NumInitializedBlocks != this->m_pOwnerAllocator->m_NumBlocksInPage) {
      FormatString<char[26],char[63]>
                ((string *)&pUninitializedBlock,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"m_NumInitializedBlocks == m_pOwnerAllocator->m_NumBlocksInPage",
                 (char (*) [63])this->m_pOwnerAllocator);
      pCVar1 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar1,"Allocate",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
                 ,0x6b);
      std::__cxx11::string::~string((string *)&pUninitializedBlock);
    }
    this_local = (MemoryPage *)0x0;
  }
  else {
    if (this->m_NumInitializedBlocks < this->m_pOwnerAllocator->m_NumBlocksInPage) {
      ptr = (undefined8 *)GetBlockStartAddress(this,this->m_NumInitializedBlocks);
      FillWithDebugPattern(ptr,0xcf,this->m_pOwnerAllocator->m_BlockSize);
      this->m_NumInitializedBlocks = this->m_NumInitializedBlocks + 1;
      if (this->m_NumInitializedBlocks < this->m_pOwnerAllocator->m_NumBlocksInPage) {
        pvVar2 = GetBlockStartAddress(this,this->m_NumInitializedBlocks);
        *ptr = pvVar2;
      }
      else {
        *ptr = 0;
      }
    }
    msg_2.field_2._8_8_ = this->m_pNextFreeBlock;
    dbgVerifyAddress(this,(void *)msg_2.field_2._8_8_);
    this->m_pNextFreeBlock = *this->m_pNextFreeBlock;
    uVar3 = this->m_NumFreeBlocks - 1;
    this->m_NumFreeBlocks = uVar3;
    if (this->m_NumFreeBlocks == 0) {
      if (this->m_pNextFreeBlock != (void *)0x0) {
        FormatString<char[26],char[28]>
                  ((string *)local_a0,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"m_pNextFreeBlock == nullptr",(char (*) [28])(ulong)uVar3);
        pCVar1 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar1,"Allocate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Common/src/FixedBlockMemoryAllocator.cpp"
                   ,0x94);
        std::__cxx11::string::~string((string *)local_a0);
      }
    }
    else {
      dbgVerifyAddress(this,this->m_pNextFreeBlock);
    }
    FillWithDebugPattern((void *)msg_2.field_2._8_8_,0xab,this->m_pOwnerAllocator->m_BlockSize);
    this_local = (MemoryPage *)msg_2.field_2._8_8_;
  }
  return this_local;
}

Assistant:

void* FixedBlockMemoryAllocator::MemoryPage::Allocate()
{
    VERIFY_EXPR(m_pOwnerAllocator != nullptr);

    if (m_NumFreeBlocks == 0)
    {
        VERIFY_EXPR(m_NumInitializedBlocks == m_pOwnerAllocator->m_NumBlocksInPage);
        return nullptr;
    }

    // Initialize the next block
    if (m_NumInitializedBlocks < m_pOwnerAllocator->m_NumBlocksInPage)
    {
        // Link next uninitialized block to the end of the list:

        //
        //                            ___________                      ___________
        //                           |           |                    |           |
        //                           | 0xcdcdcd  |                 -->| 0xcdcdcd  |   m_NumInitializedBlocks
        //                           |-----------|                |   |-----------|
        //                           |           |                |   |           |
        //  m_NumInitializedBlocks   | 0xcdcdcd  |      ==>        ---|           |
        //                           |-----------|                    |-----------|
        //
        //                           ~           ~                    ~           ~
        //                           |           |                    |           |
        //                       0   |           |                    |           |
        //                            -----------                      -----------
        //
        auto* pUninitializedBlock = GetBlockStartAddress(m_NumInitializedBlocks);
        FillWithDebugPattern(pUninitializedBlock, InitializedBlockMemPattern, m_pOwnerAllocator->m_BlockSize);
        void** ppNextBlock = reinterpret_cast<void**>(pUninitializedBlock);
        ++m_NumInitializedBlocks;
        if (m_NumInitializedBlocks < m_pOwnerAllocator->m_NumBlocksInPage)
            *ppNextBlock = GetBlockStartAddress(m_NumInitializedBlocks);
        else
            *ppNextBlock = nullptr;
    }

    void* res = m_pNextFreeBlock;
    dbgVerifyAddress(res);
    // Move pointer to the next free block
    m_pNextFreeBlock = *reinterpret_cast<void**>(m_pNextFreeBlock);
    --m_NumFreeBlocks;
    if (m_NumFreeBlocks != 0)
        dbgVerifyAddress(m_pNextFreeBlock);
    else
        VERIFY_EXPR(m_pNextFreeBlock == nullptr);

    FillWithDebugPattern(res, AllocatedBlockMemPattern, m_pOwnerAllocator->m_BlockSize);
    return res;
}